

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O2

void iDynTree::reducedModelAddAdditionalFrames
               (Model *fullModel,Model *reducedModel,string *linkInReducedModel,
               Traversal *linkSubModel,FreeFloatingPos *pos,LinkPositions *subModelBase_X_link,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
               *newLink_H_oldLink,bool includeAllAdditionalFrames,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *allowedAdditionalFrames)

{
  pointer plVar1;
  uint uVar2;
  JointPosDoubleArray *jointPos;
  Link *this;
  Link *pLVar3;
  LinkIndex frameIndex;
  Transform *pTVar4;
  ulong traversalIndex;
  ulong uVar5;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  link2additionalFramesAdjacencyList;
  string additionalFrameName_1;
  string additionalFrameName;
  Transform subModelBase_H_additionalFrame;
  Transform subModelBase_H_additionalFrame_1;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_208;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150 [3];
  undefined1 local_f0 [192];
  
  jointPos = FreeFloatingPos::jointPos(pos);
  computeTransformToTraversalBaseWithAdditionalTransform
            (fullModel,linkSubModel,jointPos,subModelBase_X_link,newLink_H_oldLink);
  local_208.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buildLinkToAdditionalFramesList(fullModel,&local_208);
  traversalIndex = 0;
  while( true ) {
    uVar2 = Traversal::getNrOfVisitedLinks(linkSubModel);
    if (uVar2 <= traversalIndex) break;
    this = Traversal::getLink(linkSubModel,traversalIndex);
    pLVar3 = Traversal::getParentLink(linkSubModel,traversalIndex);
    frameIndex = Link::getIndex(this);
    if (pLVar3 != (Link *)0x0) {
      Model::getFrameName_abi_cxx11_(local_150,fullModel,frameIndex);
      pTVar4 = LinkPositions::operator()(subModelBase_X_link,frameIndex);
      iDynTree::Transform::Transform((Transform *)local_f0,pTVar4);
      std::__cxx11::string::string((string *)&local_1b0,(string *)linkInReducedModel);
      std::__cxx11::string::string((string *)&local_170,(string *)local_150);
      addAdditionalFrameIfAllowed
                (reducedModel,&local_1b0,&local_170,(Transform *)local_f0,includeAllAdditionalFrames
                 ,allowedAdditionalFrames);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)local_150);
    }
    for (uVar5 = 0;
        plVar1 = local_208.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[frameIndex].
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start,
        uVar5 < (ulong)((long)local_208.
                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[frameIndex].
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)plVar1 >> 3);
        uVar5 = uVar5 + 1) {
      Model::getFrameName_abi_cxx11_(&local_1f0,fullModel,plVar1[uVar5]);
      Model::getFrameTransform((Model *)local_f0,(FrameIndex)fullModel);
      pTVar4 = LinkPositions::operator()(subModelBase_X_link,frameIndex);
      iDynTree::Transform::Transform((Transform *)local_150,pTVar4);
      iDynTree::Transform::operator*((Transform *)(local_f0 + 0x60),(Transform *)local_150);
      std::__cxx11::string::string((string *)&local_1d0,(string *)linkInReducedModel);
      std::__cxx11::string::string((string *)&local_190,(string *)&local_1f0);
      addAdditionalFrameIfAllowed
                (reducedModel,&local_1d0,&local_190,(Transform *)(local_f0 + 0x60),
                 includeAllAdditionalFrames,allowedAdditionalFrames);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    traversalIndex = traversalIndex + 1;
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector(&local_208);
  return;
}

Assistant:

void reducedModelAddAdditionalFrames(const Model& fullModel,
                                           Model& reducedModel,
                                     const std::string linkInReducedModel,
                                     const Traversal& linkSubModel,
                                     const FreeFloatingPos& pos,
                                           LinkPositions& subModelBase_X_link,
                                     const std::unordered_map<std::string, iDynTree::Transform>& newLink_H_oldLink,
                                     bool includeAllAdditionalFrames,
                                     const std::vector<std::string>& allowedAdditionalFrames)
{
    // First compute the transform between each link in the submodel and the submodel base
    computeTransformToTraversalBaseWithAdditionalTransform(fullModel,linkSubModel,pos.jointPos(),subModelBase_X_link,newLink_H_oldLink);

    // We then need to compute the list of additional frames for each link
    // This is a rather inefficient operation (given how frame information is stored in the Model
    // class) and is duplicated for each submodel, but this function should be called
    // just at configuration time, so this should be ok
    std::vector< std::vector<FrameIndex> > link2additionalFramesAdjacencyList;
    buildLinkToAdditionalFramesList(fullModel,link2additionalFramesAdjacencyList);

    // All the links in the traversal are lumped into the base
    // We then need to add all additional frames (and all the links
    // except for the base) to the model as additional frames of linkInReducedModel
    for(unsigned int traversalEl=0; traversalEl < linkSubModel.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = linkSubModel.getLink(traversalEl);
        LinkConstPtr parentLink  = linkSubModel.getParentLink(traversalEl);

        LinkIndex visitedLinkIndex = visitedLink->getIndex();

        // Add the link frame as an additional frame only for link that are not the submodel base
        if( parentLink != 0 )
        {
            std::string additionalFrameName = fullModel.getFrameName(visitedLinkIndex);
            Transform subModelBase_H_additionalFrame = subModelBase_X_link(visitedLinkIndex);

            addAdditionalFrameIfAllowed(reducedModel, linkInReducedModel,
                                        additionalFrameName, subModelBase_H_additionalFrame,
                                        includeAllAdditionalFrames, allowedAdditionalFrames);
        }

        // For all the link of the submodel, transfer their additional frame
        // to the lumped link in the reduced model
        for(size_t i = 0; i < link2additionalFramesAdjacencyList[visitedLinkIndex].size(); i++ )
        {
            FrameIndex additionalFrame = link2additionalFramesAdjacencyList[visitedLinkIndex][i];
            std::string additionalFrameName = fullModel.getFrameName(additionalFrame);

            Transform visitedLink_H_additionalFrame  = fullModel.getFrameTransform(additionalFrame);
            Transform subModelBase_H_visitedLink     = subModelBase_X_link(visitedLinkIndex);
            Transform subModelBase_H_additionalFrame =
                subModelBase_H_visitedLink*visitedLink_H_additionalFrame;

            addAdditionalFrameIfAllowed(reducedModel, linkInReducedModel,
                                        additionalFrameName, subModelBase_H_additionalFrame,
                                        includeAllAdditionalFrames, allowedAdditionalFrames);
        }
    }
}